

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O1

void summarize_cure(int tmd,effect_object_property **summaries,int *unsummarized_count)

{
  wchar_t wVar1;
  timed_failure *ptVar2;
  effect_object_property *peVar3;
  
  ptVar2 = timed_effects[tmd].fail;
  do {
    if (ptVar2 == (timed_failure *)0x0) {
      return;
    }
    if (ptVar2->code == 2) {
      wVar1 = ptVar2->idx;
      peVar3 = (effect_object_property *)mem_alloc(0x18);
      peVar3->next = *summaries;
      peVar3->idx = wVar1;
      peVar3->reslevel_min = L'Q';
      peVar3->reslevel_max = L'È';
      peVar3->kind = EFPROP_CURE_RESIST;
LAB_00145208:
      *summaries = peVar3;
    }
    else {
      if (ptVar2->code == 1) {
        wVar1 = ptVar2->idx;
        peVar3 = (effect_object_property *)mem_alloc(0x18);
        peVar3->next = *summaries;
        peVar3->idx = wVar1;
        peVar3->reslevel_min = L'\0';
        peVar3->reslevel_max = L'\0';
        peVar3->kind = EFPROP_CURE_FLAG;
        goto LAB_00145208;
      }
      *unsummarized_count = *unsummarized_count + 1;
    }
    ptVar2 = ptVar2->next;
  } while( true );
}

Assistant:

static void summarize_cure(int tmd, struct effect_object_property **summaries,
		int *unsummarized_count)
{
	const struct timed_failure *f = timed_effects[tmd].fail;

	while (f) {
		if (f->code == TMD_FAIL_FLAG_OBJECT) {
			add_to_summaries(summaries, f->idx, 0, 0,
				EFPROP_CURE_FLAG);
		} else if (f->code == TMD_FAIL_FLAG_RESIST) {
			add_to_summaries(summaries, f->idx,
				RES_LEVEL_EFFECT + 1, RES_LEVEL_MIN,
				EFPROP_CURE_RESIST);
		} else {
			++*unsummarized_count;
		}
		f = f->next;
	}
}